

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

Oop __thiscall Lodtalk::MethodCompiler::visitMethodAST(MethodCompiler *this,MethodAST *node)

{
  Assembler *pAVar1;
  VMContext *pVVar2;
  pointer ppPVar3;
  pointer ppPVar4;
  PragmaDefinition *this_00;
  uint8_t *puVar5;
  LiteralNode *this_01;
  element_type *peVar6;
  undefined8 *puVar7;
  bool bVar8;
  int iVar9;
  MethodHeader *this_02;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar10;
  ArgumentList *this_03;
  vector<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_> *pvVar11;
  PragmaList *this_04;
  Pragmas *pPVar12;
  ObjectHeader *pOVar13;
  string *psVar14;
  Parameters *pPVar15;
  Oop OVar16;
  pointer ppNVar17;
  LocalVariables *pLVar18;
  pointer psVar19;
  LocalVariables *pLVar20;
  SequenceNode *pSVar21;
  char *__function;
  size_t sVar22;
  bool hasPrimitive;
  ulong uVar23;
  long lVar24;
  LiteralNode *this_05;
  size_t size;
  long lVar25;
  Ref<Lodtalk::Pragma> pragmaObject;
  ulong local_90;
  anon_union_8_4_0eb573b0_for_Oop_0 local_58;
  VMContext *local_50;
  anon_union_8_4_0eb573b0_for_Oop_0 local_48 [2];
  long local_38;
  
  this->localContext = &node->super_FunctionalNode;
  this->temporalVectorCount = 0;
  this_02 = AST::MethodAST::getHeader(node);
  pVVar2 = this->context;
  AST::MethodHeader::getSelector_abi_cxx11_((string *)&local_58,this_02);
  aVar10 = (anon_union_8_4_0eb573b0_for_Oop_0)VMContext::makeSelector(pVVar2,(string *)&local_58);
  (this->selector).oop.field_0 = aVar10;
  if ((anon_union_8_4_0eb573b0_for_Oop_0 *)local_58.pointer != local_48) {
    operator_delete(local_58.pointer);
  }
  this_03 = AST::MethodHeader::getArgumentList(this_02);
  if (this_03 == (ArgumentList *)0x0) {
    local_90 = 0;
  }
  else {
    pvVar11 = AST::ArgumentList::getArguments(this_03);
    local_90 = (long)(pvVar11->
                     super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar11->
                     super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3;
  }
  this_04 = AST::MethodAST::getPragmaList(node);
  if ((this_04 == (PragmaList *)0x0) ||
     (pPVar12 = AST::PragmaList::getPragmas(this_04),
     (pPVar12->
     super__Vector_base<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>
     )._M_impl.super__Vector_impl_data._M_start ==
     (pPVar12->
     super__Vector_base<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>
     )._M_impl.super__Vector_impl_data._M_finish)) {
    size = 0;
    hasPrimitive = false;
  }
  else {
    pPVar12 = AST::PragmaList::getPragmas(this_04);
    ppPVar3 = (pPVar12->
              super__Vector_base<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppPVar4 = (pPVar12->
              super__Vector_base<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    size = (long)ppPVar4 - (long)ppPVar3 >> 3;
    local_50 = this->context;
    local_58.pointer = (uint8_t *)&NilObject;
    OopRef::registerSelf((OopRef *)&local_58);
    pOVar13 = (ObjectHeader *)AdditionalMethodState::basicNew(this->context,size);
    (this->additionalMethodState).reference.oop.field_0.header = pOVar13;
    if (pOVar13 == (ObjectHeader *)&NilObject) goto LAB_00138e63;
    (((Object *)&pOVar13[2].field_0x0)->super_ProtoObject).object_header_ =
         (ObjectHeader)(this->selector).oop.field_0;
    if (ppPVar4 == ppPVar3) {
      hasPrimitive = false;
    }
    else {
      local_38 = size + (size == 0);
      hasPrimitive = false;
      lVar24 = 0;
      do {
        this_00 = (pPVar12->
                  super__Vector_base<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>
                  )._M_impl.super__Vector_impl_data._M_start[lVar24];
        psVar14 = AST::PragmaDefinition::getSelectorString_abi_cxx11_(this_00);
        pPVar15 = AST::PragmaDefinition::getParameters(this_00);
        iVar9 = std::__cxx11::string::compare((char *)psVar14);
        if ((iVar9 != 0) && (iVar9 = std::__cxx11::string::compare((char *)psVar14), iVar9 != 0)) {
          iVar9 = std::__cxx11::string::compare((char *)psVar14);
          if ((iVar9 == 0) || (iVar9 = std::__cxx11::string::compare((char *)psVar14), iVar9 == 0))
          {
            hasPrimitive = true;
            MethodAssembler::Assembler::callPrimitive(&this->gen,0x100);
          }
LAB_00138b27:
          local_58.header = (ObjectHeader *)Pragma::create(this->context);
          OVar16.field_0 =
               (anon_union_8_4_0eb573b0_for_Oop_0)
               Array::basicNativeNew
                         (this->context,
                          (long)(pPVar15->
                                super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pPVar15->
                                super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 3);
          if ((anon_union_8_4_0eb573b0_for_Oop_0 *)local_58.pointer !=
              (anon_union_8_4_0eb573b0_for_Oop_0 *)&NilObject) {
            *(anon_union_8_4_0eb573b0_for_Oop_0 *)(local_58.pointer + 0x18) = OVar16.field_0;
            pVVar2 = this->context;
            psVar14 = AST::PragmaDefinition::getSelectorString_abi_cxx11_(this_00);
            aVar10 = (anon_union_8_4_0eb573b0_for_Oop_0)VMContext::makeByteSymbol(pVVar2,psVar14);
            if ((anon_union_8_4_0eb573b0_for_Oop_0 *)local_58.pointer !=
                (anon_union_8_4_0eb573b0_for_Oop_0 *)&NilObject) {
              *(anon_union_8_4_0eb573b0_for_Oop_0 *)(local_58.pointer + 0x10) = aVar10;
              puVar5 = (this->additionalMethodState).reference.oop.field_0.pointer;
              if (puVar5 == (uint8_t *)&NilObject) goto LAB_00138e63;
              ((anon_union_8_4_0eb573b0_for_Oop_0 *)(puVar5 + (lVar24 + 3) * 8))->pointer =
                   (uint8_t *)local_58;
              if ((anon_union_8_4_0eb573b0_for_Oop_0 *)local_58.pointer !=
                  (anon_union_8_4_0eb573b0_for_Oop_0 *)&NilObject) {
                lVar25 = ((anon_union_8_4_0eb573b0_for_Oop_0 *)(local_58.pointer + 0x18))->uintValue
                         + 8;
                if ((((anon_union_8_4_0eb573b0_for_Oop_0 *)(local_58.pointer + 0x18))->uintValue & 7
                    ) != 0) {
                  lVar25 = 0;
                }
                ppNVar17 = (pPVar15->
                           super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                if ((pPVar15->
                    super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>)
                    ._M_impl.super__Vector_impl_data._M_finish != ppNVar17) {
                  uVar23 = 0;
                  do {
                    this_01 = (LiteralNode *)ppNVar17[uVar23];
                    this_05 = this_01;
                    iVar9 = (*(this_01->super_Node)._vptr_Node[3])();
                    if ((char)iVar9 == '\0') {
                      AbstractASTVisitor::error
                                ((AbstractASTVisitor *)this_05,(Node *)psVar14,
                                 "Expected a literal for the pragma parameters.");
                    }
                    aVar10 = (anon_union_8_4_0eb573b0_for_Oop_0)AST::LiteralNode::getValue(this_01);
                    *(anon_union_8_4_0eb573b0_for_Oop_0 *)(lVar25 + uVar23 * 8) = aVar10;
                    uVar23 = uVar23 + 1;
                    ppNVar17 = (pPVar15->
                               super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                               )._M_impl.super__Vector_impl_data._M_start;
                  } while (uVar23 < (ulong)((long)(pPVar15->
                                                  super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                            (long)ppNVar17 >> 3));
                }
                goto LAB_00138c15;
              }
            }
          }
          __function = "T *Lodtalk::Ref<Lodtalk::Pragma>::operator->() const [T = Lodtalk::Pragma]";
          goto LAB_00138e78;
        }
        iVar9 = (*(*(pPVar15->
                    super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>)
                    ._M_impl.super__Vector_impl_data._M_start)->_vptr_Node[3])();
        hasPrimitive = true;
        if (((char)iVar9 != '\0') &&
           (OVar16 = AST::LiteralNode::getValue
                               ((LiteralNode *)
                                *(pPVar15->
                                 super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                                 )._M_impl.super__Vector_impl_data._M_start),
           ((ulong)OVar16.field_0 & 1) != 0)) {
          hasPrimitive = true;
          MethodAssembler::Assembler::callPrimitive(&this->gen,(int)((ulong)OVar16.field_0 >> 1));
          goto LAB_00138b27;
        }
LAB_00138c15:
        lVar24 = lVar24 + 1;
      } while (lVar24 != local_38);
    }
    OopRef::unregisterSelf((OopRef *)&local_58);
  }
  pLVar18 = AST::FunctionalNode::getLocalVariables(&node->super_FunctionalNode);
  psVar19 = (pLVar18->
            super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar24 = (long)(pLVar18->
                 super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)psVar19;
  if (lVar24 == 0) {
    lVar25 = 0;
  }
  else {
    lVar24 = lVar24 >> 4;
    iVar9 = this->temporalVectorCount;
    lVar24 = lVar24 + (ulong)(lVar24 == 0);
    lVar25 = 0;
    do {
      peVar6 = (psVar19->
               super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if (peVar6->isCapturedInClosure_ == true) {
        peVar6->temporalVectorIndex = iVar9;
        peVar6->temporalIndex = (int)lVar25;
        lVar25 = lVar25 + 1;
      }
      psVar19 = psVar19 + 1;
      lVar24 = lVar24 + -1;
    } while (lVar24 != 0);
  }
  if (lVar25 != 0) {
    this->temporalVectorCount = this->temporalVectorCount + 1;
  }
  sVar22 = (size_t)(lVar25 != 0);
  pLVar20 = AST::FunctionalNode::getLocalVariables(&node->super_FunctionalNode);
  psVar19 = (pLVar20->
            super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar24 = (long)(pLVar20->
                 super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)psVar19;
  if (lVar24 != 0) {
    lVar24 = lVar24 >> 4;
    iVar9 = this->temporalVectorCount;
    uVar23 = 0;
    do {
      peVar6 = (psVar19->
               super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if (peVar6->isCapturedInClosure_ == false) {
        if (uVar23 < local_90) {
          peVar6->temporalIndex = (int)uVar23;
        }
        else {
          peVar6->temporalIndex = iVar9 + (int)uVar23;
          sVar22 = sVar22 + 1;
        }
      }
      uVar23 = uVar23 + 1;
      psVar19 = psVar19 + 1;
    } while (lVar24 + (ulong)(lVar24 == 0) != uVar23);
  }
  if (lVar25 != 0) {
    pAVar1 = &this->gen;
    MethodAssembler::Assembler::pushNewArray(pAVar1,(int)lVar25);
    MethodAssembler::Assembler::popStoreTemporal(pAVar1,(int)local_90);
    if (local_90 != 0) {
      lVar24 = 0;
      uVar23 = 0;
      do {
        psVar19 = (pLVar18->
                  super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if (*(char *)(*(long *)((long)&(psVar19->
                                       super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr + lVar24) + 0x19) == '\x01') {
          MethodAssembler::Assembler::pushTemporal(pAVar1,(int)uVar23);
          lVar25 = *(long *)((long)&(psVar19->
                                    super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr + lVar24);
          MethodAssembler::Assembler::popStoreTemporalInVector
                    (pAVar1,*(int *)(lVar25 + 8),*(int *)(lVar25 + 0xc) + (int)local_90);
        }
        uVar23 = uVar23 + 1;
        lVar24 = lVar24 + 0x10;
      } while (local_90 != uVar23);
    }
  }
  pSVar21 = AST::MethodAST::getBody(node);
  (*(pSVar21->super_Node)._vptr_Node[2])(pSVar21,this);
  pAVar1 = &this->gen;
  bVar8 = MethodAssembler::Assembler::isLastReturn(pAVar1);
  if (!bVar8) {
    MethodAssembler::Assembler::returnReceiver(pAVar1);
  }
  OVar16.field_0 =
       (anon_union_8_4_0eb573b0_for_Oop_0)
       (this->additionalMethodState).reference.oop.field_0.pointer;
  if (OVar16.field_0 == (anon_union_8_4_0eb573b0_for_Oop_0)&NilObject) {
    MethodAssembler::Assembler::addLiteralAlways(pAVar1,&this->selector);
  }
  else {
    MethodAssembler::Assembler::addLiteralAlways(pAVar1,OVar16);
  }
  MethodAssembler::Assembler::addLiteralAlways(pAVar1,&this->classBinding);
  OVar16.field_0 =
       (anon_union_8_4_0eb573b0_for_Oop_0)
       MethodAssembler::Assembler::generate(pAVar1,sVar22,local_90,hasPrimitive,0);
  puVar7 = (undefined8 *)(this->additionalMethodState).reference.oop.field_0.uintValue;
  if (puVar7 != &NilObject) {
    ((anon_union_8_4_0eb573b0_for_Oop_0 *)(puVar7 + 1))->header = (ObjectHeader *)OVar16.field_0;
    puVar5 = (this->additionalMethodState).reference.oop.field_0.pointer;
    if (puVar5 == (uint8_t *)&NilObject) {
LAB_00138e63:
      __function = 
      "T *Lodtalk::Ref<Lodtalk::AdditionalMethodState>::operator->() const [T = Lodtalk::AdditionalMethodState]"
      ;
LAB_00138e78:
      __assert_fail("!isNil()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                    ,0x3bf,__function);
    }
    if (size != 0) {
      sVar22 = 0;
      do {
        ((anon_union_8_4_0eb573b0_for_Oop_0 *)(*(long *)(puVar5 + (sVar22 + 3) * 8) + 8))->header =
             (ObjectHeader *)OVar16.field_0;
        sVar22 = sVar22 + 1;
      } while (size != sVar22);
    }
  }
  return (Oop)OVar16.field_0;
}

Assistant:

Oop MethodCompiler::visitMethodAST(MethodAST *node)
{
    size_t temporalCount = 0;
    size_t argumentCount = 0;

    // Set the local context
    localContext = node;
    temporalVectorCount = 0;

	// Get the method selector.
	auto header = node->getHeader();
	selector = context->makeSelector(header->getSelector());

	// Process the arguments
	auto argumentList = header->getArgumentList();
	if(argumentList)
        argumentCount = argumentList->getArguments().size();

    // Process the pragmas.
    // Vist the pragmas
    auto pragmaList = node->getPragmaList();
    bool hasPrimitive = false;
    size_t pragmaCount = 0;
    if(pragmaList && !pragmaList->getPragmas().empty())
    {
        auto &pragmas = pragmaList->getPragmas();
        pragmaCount = pragmas.size();

        Ref<Pragma> pragmaObject(context);

        additionalMethodState = AdditionalMethodState::basicNew(context, pragmaCount);
        additionalMethodState->setSelector(selector.oop);

        for(size_t i = 0; i < pragmaCount; ++i)
        {
            auto pragma = pragmas[i];
            auto &selector = pragma->getSelectorString();
            auto &params = pragma->getParameters();
            if(selector == "primitive:" || selector == "primitive:error:")
            {
                // Numbered primitive.
                hasPrimitive = true;

                // Ensure the number parameter is a literal
                auto numberParam = params[0];
                if(!numberParam->isLiteral())
                    continue;

                // Read the number parameter.
                auto numberParamLiteral = static_cast<LiteralNode*> (params[0]);
                auto number = numberParamLiteral->getValue();
                if(!number.isSmallInteger())
                    continue;

                // Call the primitive.
                hasPrimitive = true;
                gen.callPrimitive((int)number.decodeSmallInteger());
            }
            else if(selector == "primitive:module:" || selector == "primitive:module:error:")
            {
                // Named primitive.
                hasPrimitive = true;
                gen.callPrimitive(256);
            }

            // Create the pragma.
            pragmaObject = Pragma::create(context);
            pragmaObject->arguments = Oop::fromPointer(Array::basicNativeNew(context, params.size()));
            pragmaObject->keyword = context->makeByteSymbol(pragma->getSelectorString());
            additionalMethodState->getIndexableElements()[i] = pragmaObject.getOop();

            // Set the arguments.
            auto argumentsData = reinterpret_cast<Oop*> (pragmaObject->arguments.getFirstFieldPointer());
            for(size_t j = 0; j < params.size(); ++j)
            {
                auto paramNode = params[j];
                if(!paramNode->isLiteral())
                    error(paramNode, "Expected a literal for the pragma parameters.");

                auto paramLiteralNode = static_cast<LiteralNode*> (paramNode);
                argumentsData[j] = paramLiteralNode->getValue();
            }
        }
    }

    // Count the captured variables.
    auto &blockLocals = node->getLocalVariables();
    size_t capturedCount = 0;
    for(size_t i = 0; i < blockLocals.size(); ++i)
    {
        auto &localVar = blockLocals[i];
        if(localVar->isCapturedInClosure())
        {
            localVar->setTemporalVectorIndex(temporalVectorCount);
            localVar->setTemporalIndex(int(capturedCount++));
        }
    }

    if(capturedCount)
    {
        ++temporalVectorCount;
        ++temporalCount;
    }

    // Compute the local variables indices.
    auto &localVars = node->getLocalVariables();
    for(size_t i = 0; i < localVars.size(); ++i)
    {
        auto &localVar = localVars[i];
        if(!localVar->isCapturedInClosure())
        {
            if(i < argumentCount)
                localVar->setTemporalIndex((int)i);
            else
            {
                localVar->setTemporalIndex(int(i + temporalVectorCount));
                ++temporalCount;
            }
        }
    }

    // Create the temporal vector
    if(capturedCount)
    {
        gen.pushNewArray((int)capturedCount);
        gen.popStoreTemporal((int)argumentCount);

        // Copy the captured arguments into the temp vector
        for(size_t i = 0; i < argumentCount; ++i)
        {
            auto &localVar = blockLocals[i];
            if(localVar->isCapturedInClosure())
            {
                gen.pushTemporal((int)i);
                gen.popStoreTemporalInVector(localVar->getTemporalIndex(), int(argumentCount + localVar->getTemporalVectorIndex()));
            }
        }
    }

	// Visit the method body
	node->getBody()->acceptVisitor(this);

	// Always return
	if(!gen.isLastReturn())
		gen.returnReceiver();

	// Set the method selector/additonal method state.
    if(!additionalMethodState.isNil())
        gen.addLiteralAlways(additionalMethodState.getOop());
    else
        gen.addLiteralAlways(selector);

	// Set the class binding.
	gen.addLiteralAlways(classBinding);
	Oop result = Oop::fromPointer(gen.generate(temporalCount, argumentCount, hasPrimitive));

    // Set some back pointers.
    if(!additionalMethodState.isNil())
    {
        additionalMethodState->setMethod(result);
        auto pragmas = additionalMethodState->getIndexableElements();
        for(size_t i = 0; i < pragmaCount; ++i)
        {
            auto pragma = reinterpret_cast<Pragma*> (pragmas[i].pointer);
            pragma->method = result;
        }
    }

    return result;
}